

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<ProKey,ProKey>::emplace<ProKey_const&>(QHash<ProKey,ProKey> *this,ProKey *key,ProKey *args)

{
  long in_FS_OFFSET;
  piter pVar1;
  ProKey copy;
  ProString local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.m_file = -0x55555556;
  local_58._36_4_ = 0xaaaaaaaa;
  local_58.m_hash = 0xaaaaaaaaaaaaaaaa;
  local_58.m_string.d.size = -0x5555555555555556;
  local_58.m_offset = -0x55555556;
  local_58.m_length = -0x55555556;
  local_58.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(&local_58,&key->super_ProString);
  pVar1 = (piter)emplace<ProKey_const&>(this,(ProKey *)&local_58,args);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }